

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

_Bool ts_node_has_error(TSNode self)

{
  TSNode self_00;
  undefined1 auVar1 [24];
  uint32_t uVar2;
  Subtree self_01;
  TSTree *in_stack_ffffffffffffffe8;
  
  auVar1 = self._0_24_;
  self_00.tree = in_stack_ffffffffffffffe8;
  self_00.context[0] = auVar1._0_4_;
  self_00.context[1] = auVar1._4_4_;
  self_00.context[2] = auVar1._8_4_;
  self_00.context[3] = auVar1._12_4_;
  self_00.id = (void *)auVar1._16_8_;
  self_01 = ts_node__subtree(self_00);
  uVar2 = ts_subtree_error_cost(self_01);
  return uVar2 != 0;
}

Assistant:

bool ts_node_has_error(TSNode self) {
  return ts_subtree_error_cost(ts_node__subtree(self)) > 0;
}